

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCompose.c
# Opt level: O3

DdNode * Cudd_bddSwapVariables(DdManager *dd,DdNode *f,DdNode **x,DdNode **y,int n)

{
  int iVar1;
  DdHalfWord DVar2;
  DdHalfWord DVar3;
  undefined1 auVar4 [16];
  int *permut;
  DdNode *pDVar5;
  ulong uVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  iVar1 = dd->size;
  permut = (int *)malloc((long)iVar1 * 4);
  auVar4 = _DAT_0094e250;
  if (permut == (int *)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
    pDVar5 = (DdNode *)0x0;
  }
  else {
    if (0 < iVar1) {
      lVar7 = (long)iVar1 + -1;
      auVar8._8_4_ = (int)lVar7;
      auVar8._0_8_ = lVar7;
      auVar8._12_4_ = (int)((ulong)lVar7 >> 0x20);
      uVar6 = 0;
      auVar8 = auVar8 ^ _DAT_0094e250;
      auVar9 = _DAT_0094e240;
      do {
        auVar10 = auVar9 ^ auVar4;
        if ((bool)(~(auVar10._4_4_ == auVar8._4_4_ && auVar8._0_4_ < auVar10._0_4_ ||
                    auVar8._4_4_ < auVar10._4_4_) & 1)) {
          permut[uVar6] = (int)uVar6;
        }
        if ((auVar10._12_4_ != auVar8._12_4_ || auVar10._8_4_ <= auVar8._8_4_) &&
            auVar10._12_4_ <= auVar8._12_4_) {
          permut[uVar6 + 1] = (int)uVar6 + 1;
        }
        uVar6 = uVar6 + 2;
        lVar7 = auVar9._8_8_;
        auVar9._0_8_ = auVar9._0_8_ + 2;
        auVar9._8_8_ = lVar7 + 2;
      } while ((iVar1 + 1U & 0xfffffffe) != uVar6);
    }
    if (0 < n) {
      uVar6 = 0;
      do {
        DVar2 = x[uVar6]->index;
        DVar3 = y[uVar6]->index;
        permut[(int)DVar2] = DVar3;
        permut[(int)DVar3] = DVar2;
        uVar6 = uVar6 + 1;
      } while ((uint)n != uVar6);
    }
    pDVar5 = Cudd_bddPermute(dd,f,permut);
    free(permut);
  }
  return pDVar5;
}

Assistant:

DdNode *
Cudd_bddSwapVariables(
  DdManager * dd,
  DdNode * f,
  DdNode ** x,
  DdNode ** y,
  int  n)
{
    DdNode *swapped;
    int  i, j, k;
    int  *permut;

    permut = ABC_ALLOC(int,dd->size);
    if (permut == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    for (i = 0; i < dd->size; i++) permut[i] = i;
    for (i = 0; i < n; i++) {
        j = x[i]->index;
        k = y[i]->index;
        permut[j] = k;
        permut[k] = j;
    }

    swapped = Cudd_bddPermute(dd,f,permut);
    ABC_FREE(permut);

    return(swapped);

}